

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O0

void node::fill_rld(vector<int,_std::allocator<int>_> *postr_to_rld,
                   vector<int,_std::allocator<int>_> *prel_to_size,
                   vector<int,_std::allocator<int>_> *postr_to_prel,
                   vector<int,_std::allocator<int>_> *prel_to_postr,
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *prel_to_children)

{
  int iVar1;
  value_type vVar2;
  const_reference pvVar3;
  reference pvVar4;
  const_reference this;
  const_reference this_00;
  size_type sVar5;
  undefined4 local_38;
  int i;
  int preorder;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *prel_to_children_local;
  vector<int,_std::allocator<int>_> *prel_to_postr_local;
  vector<int,_std::allocator<int>_> *postr_to_prel_local;
  vector<int,_std::allocator<int>_> *prel_to_size_local;
  vector<int,_std::allocator<int>_> *postr_to_rld_local;
  
  local_38 = 0;
  while( true ) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](prel_to_size,0);
    if (*pvVar3 <= local_38) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](postr_to_prel,(long)local_38);
    iVar1 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](prel_to_size,(long)iVar1);
    if (*pvVar3 == 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](postr_to_rld,(long)local_38);
      *pvVar4 = local_38;
    }
    else {
      this = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](prel_to_children,(long)iVar1);
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](prel_to_children,(long)iVar1);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(this_00);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this,sVar5 - 1);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](prel_to_postr,(long)*pvVar3);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](postr_to_rld,(long)*pvVar3);
      vVar2 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](postr_to_rld,(long)local_38);
      *pvVar4 = vVar2;
    }
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void fill_rld(std::vector<int>& postr_to_rld,
    const std::vector<int>& prel_to_size,
    const std::vector<int>& postr_to_prel,
    const std::vector<int>& prel_to_postr,
    const std::vector<std::vector<int>>& prel_to_children) {
  // The loop iterates over right-to-left postorder.
  int preorder = 0;
  for(int i = 0; i < prel_to_size[0]; ++i) {
    preorder = postr_to_prel[i];
    if (prel_to_size[preorder] == 1) {
      postr_to_rld[i] = i;
    } else {
      postr_to_rld[i] = postr_to_rld[prel_to_postr[prel_to_children[preorder][prel_to_children[preorder].size()-1]]];
    }
  }
}